

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::AssertionPrinter::print(AssertionPrinter *this)

{
  bool bVar1;
  OfType OVar2;
  AssertionPrinter *pAVar3;
  long in_RDI;
  string *in_stack_fffffffffffffcd8;
  AssertionResult *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  AssertionPrinter *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffd00;
  string *passOrFail;
  undefined8 in_stack_fffffffffffffd08;
  Code colour;
  AssertionPrinter *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  allocator<char> *__s;
  AssertionPrinter *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_271;
  string local_270 [12];
  Code in_stack_fffffffffffffd9c;
  AssertionPrinter *in_stack_fffffffffffffda0;
  undefined1 local_249 [40];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  undefined1 local_1d1 [40];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  undefined1 local_159 [40];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  MessageInfo *local_18;
  undefined8 local_10;
  
  colour = (Code)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  printSourceInfo(in_stack_fffffffffffffd10);
  local_18 = (MessageInfo *)
             clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        in_stack_fffffffffffffcd8);
  __gnu_cxx::
  __normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>
  ::__normal_iterator<Catch::MessageInfo*>
            ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
              *)in_stack_fffffffffffffce0,
             (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
              *)in_stack_fffffffffffffcd8);
  *(undefined8 *)(in_RDI + 0x28) = local_10;
  OVar2 = AssertionResult::getResultType(*(AssertionResult **)(in_RDI + 8));
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      anon_unknown.dwarf_96c72::passedString();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 (allocator<char> *)in_stack_fffffffffffffd10);
      printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      printOriginalExpression(in_stack_fffffffffffffd20);
      printReconstructedExpression(in_stack_fffffffffffffd20);
      bVar1 = AssertionResult::hasExpression((AssertionResult *)0x13bce3);
      if (!bVar1) {
        printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
        return;
      }
      anon_unknown.dwarf_96c72::dimColour();
      printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
      return;
    }
    if (OVar2 == Info) {
      passOrFail = (string *)local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 (allocator<char> *)in_stack_fffffffffffffd10);
      printResultType(in_stack_fffffffffffffd10,colour,passOrFail);
      std::__cxx11::string::~string((string *)(local_1d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1d1);
      printMessage(in_stack_fffffffffffffcf0);
      anon_unknown.dwarf_96c72::dimColour();
      printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
      return;
    }
    if (OVar2 == Warning) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 (allocator<char> *)in_stack_fffffffffffffd10);
      printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      printMessage(in_stack_fffffffffffffcf0);
      anon_unknown.dwarf_96c72::dimColour();
      printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(in_stack_fffffffffffffce0);
        if (bVar1) {
          anon_unknown.dwarf_96c72::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                     (allocator<char> *)in_stack_fffffffffffffd10);
          std::operator+(in_stack_fffffffffffffce8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffce0);
          printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator(&local_91);
        }
        else {
          anon_unknown.dwarf_96c72::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                     (allocator<char> *)in_stack_fffffffffffffd10);
          printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator(&local_b9);
        }
        printOriginalExpression(in_stack_fffffffffffffd20);
        printReconstructedExpression(in_stack_fffffffffffffd20);
        anon_unknown.dwarf_96c72::dimColour();
        printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
        return;
      }
      if (OVar2 == ExplicitFailure) {
        anon_unknown.dwarf_96c72::failedString();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                   (allocator<char> *)in_stack_fffffffffffffd10);
        printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
        std::__cxx11::string::~string(local_220);
        std::allocator<char>::~allocator(&local_221);
        pAVar3 = (AssertionPrinter *)local_249;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                   (allocator<char> *)in_stack_fffffffffffffd10);
        printIssue(pAVar3,in_stack_fffffffffffffcd8);
        std::__cxx11::string::~string((string *)(local_249 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_249);
        printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          anon_unknown.dwarf_96c72::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                     (allocator<char> *)in_stack_fffffffffffffd10);
          printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                     (allocator<char> *)in_stack_fffffffffffffd10);
          printIssue((AssertionPrinter *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator(&local_109);
          printMessage(in_stack_fffffffffffffcf0);
          printExpressionWas(in_stack_fffffffffffffcf0);
          anon_unknown.dwarf_96c72::dimColour();
          printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
          return;
        }
        if (OVar2 != DidntThrowException) {
          if (OVar2 != FatalErrorCondition) {
            return;
          }
          anon_unknown.dwarf_96c72::failedString();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                     (allocator<char> *)in_stack_fffffffffffffd10);
          printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator(&local_131);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_159;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10)
          ;
          printIssue((AssertionPrinter *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string((string *)(local_159 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_159);
          printMessage(in_stack_fffffffffffffcf0);
          printExpressionWas(in_stack_fffffffffffffcf0);
          anon_unknown.dwarf_96c72::dimColour();
          printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
          return;
        }
        pAVar3 = (AssertionPrinter *)anon_unknown.dwarf_96c72::failedString();
        __s = &local_181;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd20,(char *)__s,(allocator<char> *)pAVar3);
        printResultType(pAVar3,colour,in_stack_fffffffffffffd00);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator(&local_181);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd20,(char *)__s,(allocator<char> *)pAVar3);
        printIssue((AssertionPrinter *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        std::__cxx11::string::~string(local_1a8);
        std::allocator<char>::~allocator(&local_1a9);
        printExpressionWas(in_stack_fffffffffffffcf0);
        anon_unknown.dwarf_96c72::dimColour();
        printRemainingMessages(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
        return;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (allocator<char> *)in_stack_fffffffffffffd10);
  printResultType(in_stack_fffffffffffffd10,colour,in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  return;
}

Assistant:

void print() {
        printSourceInfo();

        itMessage = messages.begin();

        switch (result.getResultType()) {
        case ResultWas::Ok:
            printResultType(Colour::ResultSuccess, passedString());
            printOriginalExpression();
            printReconstructedExpression();
            if (!result.hasExpression())
                printRemainingMessages(Colour::None);
            else
                printRemainingMessages();
            break;
        case ResultWas::ExpressionFailed:
            if (result.isOk())
                printResultType(Colour::ResultSuccess, failedString() + std::string(" - but was ok"));
            else
                printResultType(Colour::Error, failedString());
            printOriginalExpression();
            printReconstructedExpression();
            printRemainingMessages();
            break;
        case ResultWas::ThrewException:
            printResultType(Colour::Error, failedString());
            printIssue("unexpected exception with message:");
            printMessage();
            printExpressionWas();
            printRemainingMessages();
            break;
        case ResultWas::FatalErrorCondition:
            printResultType(Colour::Error, failedString());
            printIssue("fatal error condition with message:");
            printMessage();
            printExpressionWas();
            printRemainingMessages();
            break;
        case ResultWas::DidntThrowException:
            printResultType(Colour::Error, failedString());
            printIssue("expected exception, got none");
            printExpressionWas();
            printRemainingMessages();
            break;
        case ResultWas::Info:
            printResultType(Colour::None, "info");
            printMessage();
            printRemainingMessages();
            break;
        case ResultWas::Warning:
            printResultType(Colour::None, "warning");
            printMessage();
            printRemainingMessages();
            break;
        case ResultWas::ExplicitFailure:
            printResultType(Colour::Error, failedString());
            printIssue("explicitly");
            printRemainingMessages(Colour::None);
            break;
            // These cases are here to prevent compiler warnings
        case ResultWas::Unknown:
        case ResultWas::FailureBit:
        case ResultWas::Exception:
            printResultType(Colour::Error, "** internal error **");
            break;
        }
    }